

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve_geometry_device.cpp
# Opt level: O3

Vec3fa __thiscall
embree::interpolate_catmull_rom(embree *this,TutorialData *data,uint primID,float u)

{
  Vec3fa *pVVar1;
  Vec3fa *pVVar2;
  Vec3fa *pVVar3;
  Vec3fa *pVVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  Vec3fa VVar17;
  
  pVVar4 = data->hair_vertex_colors;
  fVar12 = 1.0 - u;
  fVar15 = -u * fVar12 * fVar12;
  fVar13 = -fVar12 * u * u;
  fVar16 = (u * 3.0 + -5.0) * u * u + 2.0;
  fVar14 = (fVar12 * 3.0 + -5.0) * fVar12 * fVar12 + 2.0;
  pVVar1 = pVVar4 + primID;
  fVar12 = (pVVar1->field_0).m128[2];
  fVar5 = (pVVar1->field_0).m128[3];
  pVVar2 = pVVar4 + (primID + 1);
  fVar6 = (pVVar2->field_0).m128[2];
  fVar7 = (pVVar2->field_0).m128[3];
  pVVar3 = pVVar4 + (primID + 2);
  fVar8 = (pVVar3->field_0).m128[2];
  fVar9 = (pVVar3->field_0).m128[3];
  pVVar4 = pVVar4 + (primID + 3);
  fVar10 = (pVVar4->field_0).m128[2];
  fVar11 = (pVVar4->field_0).m128[3];
  VVar17.field_0._8_4_ =
       (fVar13 * (pVVar4->field_0).m128[0] +
       fVar14 * (pVVar3->field_0).m128[0] +
       fVar16 * (pVVar2->field_0).m128[0] + fVar15 * (pVVar1->field_0).m128[0]) * 0.5;
  VVar17.field_0._12_4_ =
       (fVar13 * (pVVar4->field_0).m128[1] +
       fVar14 * (pVVar3->field_0).m128[1] +
       fVar16 * (pVVar2->field_0).m128[1] + fVar15 * (pVVar1->field_0).m128[1]) * 0.5;
  *(float *)this = VVar17.field_0._8_4_;
  *(float *)(this + 4) = VVar17.field_0._12_4_;
  *(float *)(this + 8) = (fVar13 * fVar10 + fVar14 * fVar8 + fVar16 * fVar6 + fVar15 * fVar12) * 0.5
  ;
  *(float *)(this + 0xc) =
       (fVar13 * fVar11 + fVar14 * fVar9 + fVar16 * fVar7 + fVar15 * fVar5) * 0.5;
  VVar17.field_0._0_8_ = 0x40000000;
  return (Vec3fa)VVar17.field_0;
}

Assistant:

Vec3fa interpolate_catmull_rom(const TutorialData& data, unsigned int primID, float u)
{
  const Vec3fa c0 = ((Vec3fa*) data.hair_vertex_colors)[primID+0];
  const Vec3fa c1 = ((Vec3fa*) data.hair_vertex_colors)[primID+1];
  const Vec3fa c2 = ((Vec3fa*) data.hair_vertex_colors)[primID+2];
  const Vec3fa c3 = ((Vec3fa*) data.hair_vertex_colors)[primID+3];
  const float t  = u;
  const float s  = 1.0f - u;
  const float n0 = - t * s * s;
  const float n1 = 2.0f + t * t * (3.0f * t - 5.0f);
  const float n2 = 2.0f + s * s * (3.0f * s - 5.0f);
  const float n3 = - s * t * t;
  return Vec3fa(0.5f*(n0*c0 + n1*c1 + n2*c2 + n3*c3));
}